

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void mct_encode(int *c0,int *c1,int *c2,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int v;
  int u;
  int y;
  int b;
  int g;
  int r;
  int i;
  int n_local;
  int *c2_local;
  int *c1_local;
  int *c0_local;
  
  for (i = 0; i < n; i = i + 1) {
    iVar1 = c0[i];
    iVar2 = c1[i];
    iVar3 = c2[i];
    c0[i] = iVar1 + iVar2 * 2 + iVar3 >> 2;
    c1[i] = iVar3 - iVar2;
    c2[i] = iVar1 - iVar2;
  }
  return;
}

Assistant:

void mct_encode(
		int* restrict c0,
		int* restrict c1,
		int* restrict c2,
		int n)
{
	int i;
	for(i = 0; i < n; ++i) {
		int r = c0[i];
		int g = c1[i];
		int b = c2[i];
		int y = (r + (g * 2) + b) >> 2;
		int u = b - g;
		int v = r - g;
		c0[i] = y;
		c1[i] = u;
		c2[i] = v;
	}
}